

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestRunScriptCommand::InitialPass
          (cmCTestRunScriptCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  cmCTest *ctest;
  bool bVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  string_view value;
  string local_98;
  string_view local_78;
  int local_68 [2];
  int ret;
  undefined1 local_58 [8];
  string returnVariable;
  uint local_30;
  int start;
  uint i;
  bool np;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestRunScriptCommand *this_local;
  
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar2) {
    cmCTestScriptHandler::RunCurrentScript((this->super_cmCTestCommand).CTestScriptHandler);
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    bVar2 = std::operator==(pvVar4,"NEW_PROCESS");
    local_30 = (uint)bVar2;
    returnVariable.field_2._12_4_ = local_30;
    std::__cxx11::string::string((string *)local_58);
    local_30 = returnVariable.field_2._12_4_;
    while( true ) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (sVar5 <= local_30) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_30);
      bVar3 = std::operator==(pvVar4,"RETURN_VALUE");
      if (bVar3) {
        local_30 = local_30 + 1;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args);
        if (local_30 < sVar5) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_30);
          std::__cxx11::string::operator=((string *)local_58,(string *)pvVar4);
        }
      }
      local_30 = local_30 + 1;
    }
    local_30 = returnVariable.field_2._12_4_;
    while( true ) {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args);
      if (sVar5 <= local_30) break;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_30);
      bVar3 = std::operator==(pvVar4,"RETURN_VALUE");
      if (bVar3) {
        local_30 = local_30 + 1;
      }
      else {
        pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
        ctest = (this->super_cmCTestCommand).CTest;
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_30);
        cmCTestScriptHandler::RunScript(ctest,pcVar1,pvVar4,(bool)(~bVar2 & 1),local_68);
        pcVar1 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
        std::__cxx11::to_string(&local_98,local_68[0]);
        value = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
        local_78 = value;
        cmMakefile::AddDefinition(pcVar1,(string *)local_58,value);
        std::__cxx11::string::~string((string *)&local_98);
      }
      local_30 = local_30 + 1;
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return true;
}

Assistant:

bool cmCTestRunScriptCommand::InitialPass(std::vector<std::string> const& args,
                                          cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->CTestScriptHandler->RunCurrentScript();
    return true;
  }

  bool np = false;
  unsigned int i = 0;
  if (args[i] == "NEW_PROCESS") {
    np = true;
    i++;
  }
  int start = i;
  // run each script
  std::string returnVariable;
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
      if (i < args.size()) {
        returnVariable = args[i];
      }
    }
  }
  for (i = start; i < args.size(); ++i) {
    if (args[i] == "RETURN_VALUE") {
      ++i;
    } else {
      int ret;
      cmCTestScriptHandler::RunScript(this->CTest, this->Makefile, args[i],
                                      !np, &ret);
      this->Makefile->AddDefinition(returnVariable, std::to_string(ret));
    }
  }
  return true;
}